

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O3

void __thiscall DIS::FastEntityStatePdu::~FastEntityStatePdu(FastEntityStatePdu *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  
  (this->super_EntityInformationFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__FastEntityStatePdu_001b4bc8;
  pVVar1 = (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar3 = pVVar1;
  if (pVVar2 != pVVar1) {
    do {
      (**pVVar3->_vptr_VariableParameter)(pVVar3);
      pVVar3 = pVVar3 + 1;
    } while (pVVar3 != pVVar2);
    (this->_variableParameters).
    super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::~vector
            (&this->_variableParameters);
  EntityInformationFamilyPdu::~EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  return;
}

Assistant:

FastEntityStatePdu::~FastEntityStatePdu()
{
    _variableParameters.clear();
}